

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int experimental_batch_alloc_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  size_t __n;
  size_t filled;
  size_t local_28;
  
  if (oldlenp == (size_t *)0x0 || oldp == (void *)0x0) {
    if (oldlenp == (size_t *)0x0) {
      return 0x16;
    }
  }
  else if (*oldlenp == 8) {
    if (newlen != 0x20 || newp == (void *)0x0) {
      return 0x16;
    }
    local_28 = duckdb_je_batch_alloc
                         (*newp,*(size_t *)((long)newp + 8),*(size_t *)((long)newp + 0x10),
                          *(int *)((long)newp + 0x18));
    uVar1 = *oldlenp;
    if (uVar1 != 8) {
      __n = 8;
      if (uVar1 < 8) {
        __n = uVar1;
      }
      switchD_00b03519::default(oldp,&local_28,__n);
      *oldlenp = __n;
      return 0x16;
    }
    *(size_t *)oldp = local_28;
    return 0;
  }
  *oldlenp = 0;
  return 0x16;
}

Assistant:

static int
experimental_batch_alloc_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;

	VERIFY_READ(size_t);

	batch_alloc_packet_t batch_alloc_packet;
	ASSURED_WRITE(batch_alloc_packet, batch_alloc_packet_t);
	size_t filled = batch_alloc(batch_alloc_packet.ptrs,
	    batch_alloc_packet.num, batch_alloc_packet.size,
	    batch_alloc_packet.flags);
	READ(filled, size_t);

	ret = 0;

label_return:
	return ret;
}